

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  GetterXsYs<float> *pGVar7;
  TransformerLinLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  long lVar14;
  double dVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  lVar14 = (long)(((pGVar7->Offset + prim + 1) % iVar5 + iVar5) % iVar5) * (long)pGVar7->Stride;
  fVar2 = *(float *)((long)pGVar7->Xs + lVar14);
  dVar15 = log10((double)*(float *)((long)pGVar7->Ys + lVar14) /
                 GImPlot->CurrentPlot->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar9 = pIVar12->CurrentPlot;
  dVar3 = pIVar9->YAxis[iVar5].Range.Min;
  IVar16.x = (float)(((double)fVar2 - (pIVar9->XAxis).Range.Min) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar5].Min.x);
  fVar17 = (float)((((double)(float)(dVar15 / pIVar12->LogDenY[iVar5]) *
                     (pIVar9->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) * pIVar12->My[iVar5]
                  + (double)pIVar12->PixelRange[iVar5].Min.y);
  fVar2 = (this->P1).x;
  fVar18 = (this->P1).y;
  fVar19 = fVar18;
  if (fVar17 <= fVar18) {
    fVar19 = fVar17;
  }
  bVar13 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar18 = (float)(-(uint)(fVar17 <= fVar18) & (uint)fVar18 |
                      ~-(uint)(fVar17 <= fVar18) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     bVar13 = false, *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar2;
    if (IVar16.x <= fVar2) {
      fVar18 = IVar16.x;
    }
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(IVar16.x <= fVar2) & (uint)IVar16.x |
                      -(uint)(IVar16.x <= fVar2) & (uint)fVar2);
      bVar13 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar13 != false) {
    fVar18 = (this->P1).y;
    fVar19 = fVar18 + this->HalfWeight;
    fVar18 = fVar18 - this->HalfWeight;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar2;
    (pIVar10->pos).y = fVar19;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = IVar16.x;
    pIVar10[1].pos.y = fVar18;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar2;
    pIVar10[2].pos.y = fVar18;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = IVar16.x;
    pIVar10[3].pos.y = fVar19;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar19 = IVar16.x - this->HalfWeight;
    fVar18 = this->HalfWeight + IVar16.x;
    fVar2 = (this->P1).y;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar19;
    pIVar10[4].pos.y = fVar17;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar18;
    pIVar10[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar19;
    pIVar10[2].pos.y = fVar2;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar18;
    pIVar10[3].pos.y = fVar17;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar16.y = fVar17;
  this->P1 = IVar16;
  return bVar13;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }